

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_ParseWithLengthOpts
                  (char *value,size_t buffer_length,char **return_parse_end,
                  cJSON_bool require_null_terminated)

{
  int iVar1;
  cJSON_bool cVar2;
  cJSON *item;
  parse_buffer *ppVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  parse_buffer buffer;
  parse_buffer local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  item = (cJSON *)0x0;
  local_68.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_68.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_68.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_68.offset = 0;
  local_68.depth = 0;
  local_68.content = (uchar *)0x0;
  local_68.length = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (buffer_length != 0 && value != (char *)0x0) {
    local_68.offset = 0;
    local_68.hooks.allocate =
         (_func_void_ptr_size_t *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_);
    local_68.hooks.deallocate =
         (_func_void_void_ptr *)
         CONCAT44(global_hooks.deallocate._4_4_,global_hooks.deallocate._0_4_);
    local_68.hooks.reallocate = global_hooks.reallocate;
    local_68.content = (uchar *)value;
    local_68.length = buffer_length;
    item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))
                              (0x40);
    if (item == (cJSON *)0x0) {
      item = (cJSON *)0x0;
    }
    else {
      item->valuedouble = 0.0;
      item->string = (char *)0x0;
      item->valuestring = (char *)0x0;
      *(undefined8 *)&item->valueint = 0;
      item->child = (cJSON *)0x0;
      *(undefined8 *)&item->type = 0;
      item->next = (cJSON *)0x0;
      item->prev = (cJSON *)0x0;
      ppVar3 = (parse_buffer *)0x0;
      if ((((local_68.content != (uchar *)0x0) && (local_68.offset == 0)) &&
          (ppVar3 = &local_68, 4 < local_68.length)) &&
         (iVar1 = strncmp((char *)local_68.content,anon_var_dwarf_1bf,3), ppVar3 = &local_68,
         iVar1 == 0)) {
        local_68.offset = 3;
        ppVar3 = &local_68;
      }
      ppVar3 = buffer_skip_whitespace(ppVar3);
      cVar2 = parse_value(item,ppVar3);
      if (cVar2 != 0) {
        if (require_null_terminated != 0) {
          if ((local_68.content != (uchar *)0x0) && (local_68.offset < local_68.length)) {
            do {
              sVar4 = local_68.offset;
              if (0x20 < local_68.content[local_68.offset]) break;
              local_68.offset = local_68.offset + 1;
              sVar4 = local_68.length;
            } while (local_68.length != local_68.offset);
            if (sVar4 == local_68.length) {
              local_68.offset = sVar4 - 1;
            }
          }
          if ((local_68.length <= local_68.offset) || (local_68.content[local_68.offset] != '\0'))
          goto LAB_001036e2;
        }
        if (return_parse_end != (char **)0x0) {
          *return_parse_end = (char *)(local_68.content + local_68.offset);
        }
        goto LAB_0010372f;
      }
    }
  }
LAB_001036e2:
  if (item != (cJSON *)0x0) {
    cJSON_Delete(item);
  }
  if (value != (char *)0x0) {
    global_error_1 = 0;
    if (local_68.length != 0) {
      global_error_1 = local_68.length - 1;
    }
    if (local_68.offset < local_68.length) {
      global_error_1 = local_68.offset;
    }
    global_error_0 = value;
    if (return_parse_end != (char **)0x0) {
      *return_parse_end = value + global_error_1;
    }
  }
  item = (cJSON *)0x0;
LAB_0010372f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithLengthOpts(const char *value, size_t buffer_length, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL || 0 == buffer_length)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = buffer_length; 
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(skip_utf8_bom(&buffer))))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }

        global_error = local_error;
    }

    return NULL;
}